

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O1

shared_ptr<suisha::t_timer> __thiscall
suisha::t_loop::f_timer
          (t_loop *this,function<void_()> *a_function,milliseconds *a_interval,bool a_single)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<suisha::t_timer> sVar1;
  bool local_3a;
  undefined1 local_39;
  function<void_()> *local_38;
  
  f_check((t_loop *)a_function);
  *(undefined8 *)this = 0;
  local_38 = a_function;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<suisha::t_timer,std::allocator<suisha::t_timer>,suisha::t_loop*,std::function<void()>,std::chrono::duration<long,std::ratio<1l,1000l>>const&,bool&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(t_timer **)this,
             (allocator<suisha::t_timer> *)&local_39,(t_loop **)&local_38,
             (function<void_()> *)a_interval,
             (duration<long,_std::ratio<1L,_1000L>_> *)CONCAT71(in_register_00000009,a_single),
             &local_3a);
  suisha::t_loop::f_queue((shared_ptr *)a_function);
  sVar1.super___shared_ptr<suisha::t_timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<suisha::t_timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<suisha::t_timer>)
         sVar1.super___shared_ptr<suisha::t_timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<t_timer> f_timer(std::function<void()>&& a_function, const std::chrono::milliseconds& a_interval, bool a_single = false)
	{
		f_check();
		auto timer = std::make_shared<t_timer>(this, std::move(a_function), a_interval, a_single);
		f_queue(timer);
		return timer;
	}